

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

SpecparamDeclarationSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::SpecparamDeclarationSyntax,slang::syntax::SpecparamDeclarationSyntax_const&>
          (BumpAllocator *this,SpecparamDeclarationSyntax *args)

{
  SyntaxNode *pSVar1;
  size_t sVar2;
  Info *pIVar3;
  undefined4 uVar4;
  undefined1 uVar5;
  NumericTokenFlags NVar6;
  uint32_t uVar7;
  SpecparamDeclarationSyntax *pSVar8;
  
  pSVar8 = (SpecparamDeclarationSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((SpecparamDeclarationSyntax *)this->endPtr < pSVar8 + 1) {
    pSVar8 = (SpecparamDeclarationSyntax *)allocateSlow(this,0xb0,8);
  }
  else {
    this->head->current = (byte *)(pSVar8 + 1);
  }
  (pSVar8->super_MemberSyntax).super_SyntaxNode.previewNode =
       (args->super_MemberSyntax).super_SyntaxNode.previewNode;
  uVar4 = *(undefined4 *)&(args->super_MemberSyntax).super_SyntaxNode.field_0x4;
  pSVar1 = (args->super_MemberSyntax).super_SyntaxNode.parent;
  (pSVar8->super_MemberSyntax).super_SyntaxNode.kind =
       (args->super_MemberSyntax).super_SyntaxNode.kind;
  *(undefined4 *)&(pSVar8->super_MemberSyntax).super_SyntaxNode.field_0x4 = uVar4;
  (pSVar8->super_MemberSyntax).super_SyntaxNode.parent = pSVar1;
  uVar4 = *(undefined4 *)
           &(args->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.field_0x4;
  pSVar1 = (args->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent;
  (pSVar8->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.kind =
       (args->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.kind;
  *(undefined4 *)
   &(pSVar8->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar4;
  (pSVar8->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent = pSVar1;
  (pSVar8->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.previewNode =
       (args->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.previewNode;
  (pSVar8->super_MemberSyntax).attributes.super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_005c7548;
  (pSVar8->super_MemberSyntax).attributes.super_SyntaxListBase.childCount =
       (args->super_MemberSyntax).attributes.super_SyntaxListBase.childCount;
  sVar2 = (args->super_MemberSyntax).attributes.
          super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
          _M_extent_value;
  (pSVar8->super_MemberSyntax).attributes.
  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr =
       (args->super_MemberSyntax).attributes.
       super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr;
  (pSVar8->super_MemberSyntax).attributes.
  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
  _M_extent_value = sVar2;
  (pSVar8->super_MemberSyntax).attributes.super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_005c7a10;
  (pSVar8->type).ptr = (args->type).ptr;
  uVar5 = (args->keyword).field_0x2;
  NVar6.raw = (args->keyword).numFlags.raw;
  uVar7 = (args->keyword).rawLen;
  pIVar3 = (args->keyword).info;
  (pSVar8->keyword).kind = (args->keyword).kind;
  (pSVar8->keyword).field_0x2 = uVar5;
  (pSVar8->keyword).numFlags = (NumericTokenFlags)NVar6.raw;
  (pSVar8->keyword).rawLen = uVar7;
  (pSVar8->keyword).info = pIVar3;
  uVar4 = *(undefined4 *)&(args->declarators).super_SyntaxListBase.super_SyntaxNode.field_0x4;
  pSVar1 = (args->declarators).super_SyntaxListBase.super_SyntaxNode.parent;
  (pSVar8->declarators).super_SyntaxListBase.super_SyntaxNode.kind =
       (args->declarators).super_SyntaxListBase.super_SyntaxNode.kind;
  *(undefined4 *)&(pSVar8->declarators).super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar4;
  (pSVar8->declarators).super_SyntaxListBase.super_SyntaxNode.parent = pSVar1;
  (pSVar8->declarators).super_SyntaxListBase.super_SyntaxNode.previewNode =
       (args->declarators).super_SyntaxListBase.super_SyntaxNode.previewNode;
  (pSVar8->declarators).super_SyntaxListBase.childCount =
       (args->declarators).super_SyntaxListBase.childCount;
  (pSVar8->declarators).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_005cb7a0;
  sVar2 = (args->declarators).elements._M_extent._M_extent_value;
  (pSVar8->declarators).elements._M_ptr = (args->declarators).elements._M_ptr;
  (pSVar8->declarators).elements._M_extent._M_extent_value = sVar2;
  uVar5 = (args->semi).field_0x2;
  NVar6.raw = (args->semi).numFlags.raw;
  uVar7 = (args->semi).rawLen;
  pIVar3 = (args->semi).info;
  (pSVar8->semi).kind = (args->semi).kind;
  (pSVar8->semi).field_0x2 = uVar5;
  (pSVar8->semi).numFlags = (NumericTokenFlags)NVar6.raw;
  (pSVar8->semi).rawLen = uVar7;
  (pSVar8->semi).info = pIVar3;
  return pSVar8;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }